

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeThumbAddSPReg(MCInst *Inst,uint16_t Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint uVar3;
  DecodeStatus DVar4;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint16_t in_SI;
  MCInst *in_RDI;
  uint Rm;
  uint Rdm;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffd0;
  uint RegNo;
  undefined6 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  uVar3 = MCInst_getOpcode(in_RDI);
  if (uVar3 == 0xa8c) {
    uVar2 = fieldFromInstruction_2(in_SI,0,3);
    uVar3 = (uint)uVar2;
    uVar2 = fieldFromInstruction_2(in_SI,7,1);
    uVar3 = (uint)uVar2 << 3 | uVar3;
    DVar4 = DecodeGPRRegisterClass
                      ((MCInst *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                       (void *)CONCAT44(local_4,uVar3));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
    if (_Var1) {
      MCOperand_CreateReg0(in_RDI,0xc);
      DVar4 = DecodeGPRRegisterClass
                        ((MCInst *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                         (void *)CONCAT44(local_4,uVar3));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (!_Var1) {
        local_4 = MCDisassembler_Fail;
      }
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    uVar3 = MCInst_getOpcode(in_RDI);
    if (uVar3 == 0xa90) {
      fieldFromInstruction_2(in_SI,3,4);
      MCOperand_CreateReg0(in_RDI,0xc);
      MCOperand_CreateReg0(in_RDI,0xc);
      DVar4 = DecodeGPRRegisterClass
                        ((MCInst *)CONCAT26(in_SI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                         (void *)CONCAT44(local_4,in_stack_ffffffffffffffd0));
      _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar4);
      if (!_Var1) {
        local_4 = MCDisassembler_Fail;
      }
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeThumbAddSPReg(MCInst *Inst, uint16_t Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	if (MCInst_getOpcode(Inst) == ARM_tADDrSP) {
		unsigned Rdm = fieldFromInstruction_2(Insn, 0, 3);
		Rdm |= fieldFromInstruction_2(Insn, 7, 1) << 3;

		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rdm, Address, Decoder)))
			return MCDisassembler_Fail;
	} else if (MCInst_getOpcode(Inst) == ARM_tADDspr) {
		unsigned Rm = fieldFromInstruction_2(Insn, 3, 4);

		MCOperand_CreateReg0(Inst, ARM_SP);
		MCOperand_CreateReg0(Inst, ARM_SP);
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}